

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.cpp
# Opt level: O0

bool nullcInitStringModule(void)

{
  nullres nVar1;
  bool local_9;
  
  nVar1 = nullcBindModuleFunctionHelper<int,NULLCArray>("std.string",NULLCString::strlen,"strlen",0)
  ;
  if (nVar1 == '\0') {
    local_9 = false;
  }
  else {
    nVar1 = nullcBindModuleFunctionHelper<int,NULLCArray,NULLCArray>
                      ("std.string",NULLCString::strstr,"strstr",0);
    if (nVar1 == '\0') {
      local_9 = false;
    }
    else {
      nVar1 = nullcBindModuleFunctionHelper<int,NULLCArray,char>
                        ("std.string",NULLCString::strchr,"strchr",0);
      if (nVar1 == '\0') {
        local_9 = false;
      }
      else {
        nVar1 = nullcBindModuleFunctionHelper<int,NULLCArray,NULLCArray>
                          ("std.string",NULLCString::strcmp,"strcmp",0);
        if (nVar1 == '\0') {
          local_9 = false;
        }
        else {
          nVar1 = nullcBindModuleFunctionHelper<int,NULLCArray,NULLCArray>
                            ("std.string",NULLCString::strcpy,"strcpy",0);
          if (nVar1 == '\0') {
            local_9 = false;
          }
          else {
            local_9 = true;
          }
        }
      }
    }
  }
  return local_9;
}

Assistant:

bool	nullcInitStringModule()
{
	REGISTER_FUNC(strlen, "strlen", 0);
	REGISTER_FUNC(strstr, "strstr", 0);
	REGISTER_FUNC(strchr, "strchr", 0);
	REGISTER_FUNC(strcmp, "strcmp", 0);
	REGISTER_FUNC(strcpy, "strcpy", 0);

	return true;
}